

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O0

void __thiscall
Importer_resolveWithMissingChildComponents_Test::Importer_resolveWithMissingChildComponents_Test
          (Importer_resolveWithMissingChildComponents_Test *this)

{
  Importer_resolveWithMissingChildComponents_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Importer_resolveWithMissingChildComponents_Test_001a1568;
  return;
}

Assistant:

TEST(Importer, resolveWithMissingChildComponents)
{
    std::string e = "Import of component 'child' from '" + resourcePath("importer/") + "components_source.cellml' requires component named 'i_dont_exist' which cannot be found.";
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/importing_component_with_missing_children.cellml"));
    EXPECT_EQ(size_t(0), parser->issueCount());

    auto importer = libcellml::Importer::create();
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->issueCount());
    EXPECT_EQ(e, importer->issue(0)->description());
}